

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_server_hello(ptls_t *tls,st_ptls_server_hello_t *sh,uint8_t *src,uint8_t *end)

{
  code *pcVar1;
  undefined8 uVar2;
  uint16_t uVar3;
  st_ptls_server_hello_t *psVar4;
  int iVar5;
  ptls_cipher_suite_t *ppVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  ptls_iovec_t pVar10;
  uint8_t *local_178;
  size_t local_170;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  undefined1 auStack_138 [6];
  uint16_t group;
  size_t local_130;
  uint8_t *local_128;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  st_ptls_extension_bitmap_t bitmap;
  uint16_t local_c8;
  uint16_t local_c6;
  uint8_t local_c3;
  uint16_t selected_psk_identity;
  uint16_t found_version;
  uint16_t exttype;
  uint8_t method;
  uint16_t csid;
  size_t local_b8;
  uint8_t *local_b0;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint local_2c;
  uint8_t *puStack_28;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  st_ptls_server_hello_t *sh_local;
  ptls_t *tls_local;
  
  puStack_28 = end;
  end_local = src;
  src_local = sh->random_;
  sh_local = (st_ptls_server_hello_t *)tls;
  memset(&_capacity,0,0x58);
  memcpy(sh,&_capacity,0x58);
  if ((long)puStack_28 - (long)end_local < 2) {
    local_2c = 0x32;
  }
  else {
    end_local = end_local + 2;
    if ((long)puStack_28 - (long)end_local < 0x20) {
      local_2c = 0x32;
    }
    else {
      iVar5 = memcmp(end_local,hello_retry_random,0x20);
      puVar8 = src_local;
      *(uint *)(src_local + 0x30) = (uint)(iVar5 == 0);
      _block_size = 1;
      if (puStack_28 == end_local + 0x20) {
        local_2c = 0x32;
      }
      else {
        _block_size64 = 0;
        end_local = end_local + 0x20;
        do {
          puVar9 = end_local + 1;
          _block_size64 = _block_size64 << 8 | (ulong)*end_local;
          _block_size = _block_size - 1;
          end_local = puVar9;
        } while (_block_size != 0);
        if ((ulong)((long)puStack_28 - (long)puVar9) < _block_size64) {
          local_2c = 0x32;
        }
        else {
          local_b0 = puVar9 + _block_size64;
          if ((long)local_b0 - (long)puVar9 < 0x21) {
            _found_version = ptls_iovec_init(puVar9,(long)local_b0 - (long)puVar9);
            *(uint8_t **)(puVar8 + 0x20) = _found_version;
            *(size_t *)(puVar8 + 0x28) = local_b8;
            end_local = local_b0;
            local_2c = ptls_decode16(&selected_psk_identity,&end_local,puStack_28);
            if (local_2c == 0) {
              ppVar6 = ptls_find_cipher_suite
                                 (*(ptls_cipher_suite_t ***)(*(long *)sh_local->random_ + 0x18),
                                  selected_psk_identity);
              sh_local[3].field_3.peerkey.base = (uint8_t *)ppVar6;
              if (ppVar6 == (ptls_cipher_suite_t *)0x0) {
                local_2c = 0x2f;
              }
              else {
                local_2c = ptls_decode8(&local_c3,&end_local,puStack_28);
                if (local_2c == 0) {
                  if (local_c3 == '\0') {
                    if (*(int *)(src_local + 0x30) != 0) {
                      src_local[0x38] = 0xff;
                      src_local[0x39] = 0xff;
                    }
                    local_c8 = 0xffff;
                    bitmap.bits._6_2_ = -1;
                    memset(&_capacity_1,0,8);
                    _block_size_1 = 2;
                    if ((ulong)((long)puStack_28 - (long)end_local) < 2) {
                      local_2c = 0x32;
                    }
                    else {
                      _block_size64_1 = 0;
                      do {
                        puVar8 = end_local + 1;
                        _block_size64_1 = _block_size64_1 << 8 | (ulong)*end_local;
                        _block_size_1 = _block_size_1 - 1;
                        end_local = puVar8;
                      } while (_block_size_1 != 0);
                      if ((ulong)((long)puStack_28 - (long)puVar8) < _block_size64_1) {
                        local_2c = 0x32;
                      }
                      else {
                        _capacity_2 = (size_t)(puVar8 + _block_size64_1);
                        _block_size_1 = 0;
                        do {
                          if (end_local == (uint8_t *)_capacity_2) {
                            if (end_local != (uint8_t *)_capacity_2) {
                              return 0x32;
                            }
                            if (end_local != puStack_28) {
                              return 0x32;
                            }
                            iVar5 = is_supported_version(local_c8);
                            if (iVar5 == 0) {
                              return 0x2f;
                            }
                            if (*(int *)(src_local + 0x30) == 0) {
                              if (bitmap.bits._6_2_ != -1) {
                                if ((undefined1  [32])
                                    ((undefined1  [32])sh_local[6].field_3 & (undefined1  [32])0x1)
                                    == (undefined1  [32])0x0) {
                                  return 0x2f;
                                }
                                if (bitmap.bits._6_2_ != 0) {
                                  return 0x2f;
                                }
                                *(byte *)&sh_local[5].is_retry_request =
                                     (byte)sh_local[5].is_retry_request & 0xfd | 2;
                              }
                              if ((*(long *)(src_local + 0x38) == 0) &&
                                 (((byte)sh_local[5].is_retry_request >> 1 & 1) == 0)) {
                                return 0x2f;
                              }
                            }
                            return 0;
                          }
                          local_2c = ptls_decode16(&local_c6,&end_local,(uint8_t *)_capacity_2);
                          if (local_2c != 0) {
                            return local_2c;
                          }
                          iVar5 = 2;
                          if (*(int *)(src_local + 0x30) != 0) {
                            iVar5 = -1;
                          }
                          iVar5 = extension_bitmap_testandset
                                            ((st_ptls_extension_bitmap_t *)&_capacity_1,iVar5,
                                             local_c6);
                          psVar4 = sh_local;
                          uVar3 = local_c6;
                          if (iVar5 == 0) {
                            return 0x2f;
                          }
                          _block_size_2 = 2;
                          if (_capacity_2 - (long)end_local < 2) {
                            return 0x32;
                          }
                          _block_size64_2 = 0;
                          do {
                            puVar8 = end_local + 1;
                            _block_size64_2 = _block_size64_2 << 8 | (ulong)*end_local;
                            _block_size_2 = _block_size_2 - 1;
                            end_local = puVar8;
                          } while (_block_size_2 != 0);
                          if (_capacity_2 - (long)puVar8 < _block_size64_2) {
                            return 0x32;
                          }
                          local_128 = puVar8 + _block_size64_2;
                          if (*(long *)(*(long *)sh_local->random_ + 0xf0) != 0) {
                            pcVar1 = (code *)**(undefined8 **)(*(long *)sh_local->random_ + 0xf0);
                            uVar2 = *(undefined8 *)(*(long *)sh_local->random_ + 0xf0);
                            _auStack_138 = ptls_iovec_init(puVar8,(long)local_128 - (long)puVar8);
                            iVar5 = (*pcVar1)(uVar2,psVar4,2,uVar3,_auStack_138,local_130);
                            local_2c = (uint)(iVar5 != 0);
                            if (iVar5 != 0) {
                              return local_2c;
                            }
                          }
                          puVar8 = src_local;
                          if (local_c6 == 0x29) {
                            if (*(int *)(src_local + 0x30) != 0) {
                              __assert_fail("!sh->is_retry_request",
                                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                            ,0xa7c,
                                            "int decode_server_hello(ptls_t *, struct st_ptls_server_hello_t *, const uint8_t *, const uint8_t *const)"
                                           );
                            }
                            iVar5 = ptls_decode16((uint16_t *)((long)&bitmap.bits + 6),&end_local,
                                                  local_128);
                            if (iVar5 != 0) {
                              return iVar5;
                            }
                            local_2c = 0;
                          }
                          else if (local_c6 == 0x2b) {
                            iVar5 = ptls_decode16(&local_c8,&end_local,local_128);
                            if (iVar5 != 0) {
                              return iVar5;
                            }
                            local_2c = 0;
                          }
                          else if (local_c6 == 0x2c) {
                            if (*(int *)(src_local + 0x30) == 0) {
                              __assert_fail("sh->is_retry_request",
                                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                            ,0xa71,
                                            "int decode_server_hello(ptls_t *, struct st_ptls_server_hello_t *, const uint8_t *, const uint8_t *const)"
                                           );
                            }
                            _block_size_3 = 2;
                            if ((ulong)((long)local_128 - (long)end_local) < 2) {
                              return 0x32;
                            }
                            _block_size64_3 = 0;
                            do {
                              puVar9 = end_local + 1;
                              _block_size64_3 = _block_size64_3 << 8 | (ulong)*end_local;
                              _block_size_3 = _block_size_3 - 1;
                              end_local = puVar9;
                            } while (_block_size_3 != 0);
                            if ((ulong)((long)local_128 - (long)puVar9) < _block_size64_3) {
                              return 0x32;
                            }
                            puVar7 = puVar9 + _block_size64_3;
                            if (puVar9 == puVar7) {
                              return 0x32;
                            }
                            pVar10 = ptls_iovec_init(puVar9,(long)puVar7 - (long)puVar9);
                            local_178 = pVar10.base;
                            *(uint8_t **)(puVar8 + 0x40) = local_178;
                            local_170 = pVar10.len;
                            *(size_t *)(puVar8 + 0x48) = local_170;
                            end_local = puVar7;
                            if (puVar7 != local_128) {
                              return 0x32;
                            }
                          }
                          else if (local_c6 == 0x33) {
                            if (*(long *)(*(long *)sh_local->random_ + 0x10) == 0) {
                              return 0x28;
                            }
                            if (*(int *)(src_local + 0x30) == 0) {
                              iVar5 = decode_key_share_entry
                                                ((uint16_t *)((long)&_capacity_3 + 6),
                                                 (ptls_iovec_t *)(src_local + 0x38),&end_local,
                                                 local_128);
                              if (iVar5 != 0) {
                                return iVar5;
                              }
                              if (end_local != local_128) {
                                return 0x32;
                              }
                              if ((*(long *)&sh_local[3].is_retry_request == 0) ||
                                 (**(short **)&sh_local[3].is_retry_request != _capacity_3._6_2_)) {
                                return 0x2f;
                              }
                            }
                            else {
                              iVar5 = ptls_decode16((uint16_t *)(src_local + 0x38),&end_local,
                                                    local_128);
                              if (iVar5 != 0) {
                                return iVar5;
                              }
                            }
                            local_2c = 0;
                          }
                          else if (local_c6 == 0xfe0d) {
                            if (*(int *)(src_local + 0x30) == 0) {
                              __assert_fail("sh->is_retry_request",
                                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                            ,0xa81,
                                            "int decode_server_hello(ptls_t *, struct st_ptls_server_hello_t *, const uint8_t *, const uint8_t *const)"
                                           );
                            }
                            if (((sh_local[4].random_[0x18] & 1) == 0) &&
                               ((sh_local[4].random_[0x18] >> 1 & 1) == 0)) {
                              return 0x6e;
                            }
                            if ((long)local_128 - (long)end_local != 8) {
                              return 0x32;
                            }
                            *(uint8_t **)(src_local + 0x50) = end_local;
                            end_local = local_128;
                          }
                          else {
                            end_local = local_128;
                          }
                        } while (end_local == local_128);
                        local_2c = 0x32;
                      }
                    }
                  }
                  else {
                    local_2c = 0x2f;
                  }
                }
              }
            }
          }
          else {
            local_2c = 0x32;
          }
        }
      }
    }
  }
  return local_2c;
}

Assistant:

static int decode_server_hello(ptls_t *tls, struct st_ptls_server_hello_t *sh, const uint8_t *src, const uint8_t *const end)
{
    int ret;

    *sh = (struct st_ptls_server_hello_t){{0}};

    /* ignore legacy-version */
    if (end - src < 2) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src += 2;

    /* random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    sh->is_retry_request = memcmp(src, hello_retry_random, PTLS_HELLO_RANDOM_SIZE) == 0;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        sh->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    { /* select cipher_suite */
        uint16_t csid;
        if ((ret = ptls_decode16(&csid, &src, end)) != 0)
            goto Exit;
        if ((tls->cipher_suite = ptls_find_cipher_suite(tls->ctx->cipher_suites, csid)) == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    { /* legacy_compression_method */
        uint8_t method;
        if ((ret = ptls_decode8(&method, &src, end)) != 0)
            goto Exit;
        if (method != 0) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    if (sh->is_retry_request)
        sh->retry_request.selected_group = UINT16_MAX;

    uint16_t exttype, found_version = UINT16_MAX, selected_psk_identity = UINT16_MAX;
    decode_extensions(src, end, sh->is_retry_request ? PTLS_HANDSHAKE_TYPE_PSEUDO_HRR : PTLS_HANDSHAKE_TYPE_SERVER_HELLO, &exttype,
                      {
                          if (tls->ctx->on_extension != NULL &&
                              (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_SERVER_HELLO,
                                                                exttype, ptls_iovec_init(src, end - src)) != 0))
                              goto Exit;
                          switch (exttype) {
                          case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
                              if ((ret = ptls_decode16(&found_version, &src, end)) != 0)
                                  goto Exit;
                              break;
                          case PTLS_EXTENSION_TYPE_KEY_SHARE:
                              if (tls->ctx->key_exchanges == NULL) {
                                  ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                                  goto Exit;
                              }
                              if (sh->is_retry_request) {
                                  if ((ret = ptls_decode16(&sh->retry_request.selected_group, &src, end)) != 0)
                                      goto Exit;
                              } else {
                                  uint16_t group;
                                  if ((ret = decode_key_share_entry(&group, &sh->peerkey, &src, end)) != 0)
                                      goto Exit;
                                  if (src != end) {
                                      ret = PTLS_ALERT_DECODE_ERROR;
                                      goto Exit;
                                  }
                                  if (tls->key_share == NULL || tls->key_share->id != group) {
                                      ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                      goto Exit;
                                  }
                              }
                              break;
                          case PTLS_EXTENSION_TYPE_COOKIE:
                              assert(sh->is_retry_request);
                              ptls_decode_block(src, end, 2, {
                                  if (src == end) {
                                      ret = PTLS_ALERT_DECODE_ERROR;
                                      goto Exit;
                                  }
                                  sh->retry_request.cookie = ptls_iovec_init(src, end - src);
                                  src = end;
                              });
                              break;
                          case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY:
                              assert(!sh->is_retry_request);
                              if ((ret = ptls_decode16(&selected_psk_identity, &src, end)) != 0)
                                  goto Exit;
                              break;
                          case PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO:
                              assert(sh->is_retry_request);
                              if (!(tls->ech.offered || tls->ech.offered_grease)) {
                                  ret = PTLS_ALERT_UNSUPPORTED_EXTENSION;
                                  goto Exit;
                              }
                              if (end - src != PTLS_ECH_CONFIRM_LENGTH) {
                                  ret = PTLS_ALERT_DECODE_ERROR;
                                  goto Exit;
                              }
                              sh->retry_request.ech = src;
                              src = end;
                              break;
                          default:
                              src = end;
                              break;
                          }
                      });

    if (!is_supported_version(found_version)) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    if (!sh->is_retry_request) {
        if (selected_psk_identity != UINT16_MAX) {
            if (!tls->client.offered_psk) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            if (selected_psk_identity != 0) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            tls->is_psk_handshake = 1;
        }
        if (sh->peerkey.base == NULL && !tls->is_psk_handshake) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    ret = 0;
Exit:
    return ret;
}